

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

int __thiscall
embree::TutorialBenchmark::main(TutorialBenchmark *this,int argc,char **argv,string *name)

{
  string *str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string benchmark_name;
  CommandLine commandLine;
  string local_78;
  CommandLine local_58 [2];
  vector<char_*,_std::allocator<char_*>_> local_48;
  int local_2c;
  
  local_2c = argc;
  CommandLineParser::parseCommandLine(&this->commandLineParser,argc,argv);
  updateCommandLine(this,&local_2c,argv);
  CommandLine::CommandLine
            ((CommandLine *)
             &local_48.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_2c,argv);
  CommandLine::CommandLine
            (local_58,(int)((ulong)((long)local_48.
                                          super__Vector_base<char_*,_std::allocator<char_*>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage[1] -
                                   (long)*local_48.
                                          super__Vector_base<char_*,_std::allocator<char_*>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage) >> 3),
             (char **)*local_48.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  local_48.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_58[0].cl;
  (**this->_vptr_TutorialBenchmark)(this);
  pcVar2 = (name->_M_dataplus)._M_p;
  local_58[0].cl = &local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar2,pcVar2 + name->_M_string_length);
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,".xml","");
  str = &this->inputFile;
  bVar3 = endsWith(str,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (bVar3) {
    getFileName(&local_78,str);
  }
  else {
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,".ecs","");
    bVar3 = endsWith(str,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (!bVar3) goto LAB_0024740c;
    getFileName(&local_78,str);
  }
  std::__cxx11::string::operator=((string *)local_58,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
LAB_0024740c:
  iVar4 = std::__cxx11::string::compare((char *)&(this->params).name);
  if (iVar4 != 0) {
    std::__cxx11::string::_M_assign((string *)local_58);
  }
  (*this->_vptr_TutorialBenchmark[1])
            (this,local_58,
             (ulong)((long)(((_Vector_base<char_*,_std::allocator<char_*>_> *)
                            local_48.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage)->_M_impl).
                           super__Vector_impl_data._M_finish -
                    (long)(((_Vector_base<char_*,_std::allocator<char_*>_> *)
                           local_48.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage)->_M_impl).
                          super__Vector_impl_data._M_start) >> 3);
  if (local_58[0].cl != &local_48) {
    operator_delete(local_58[0].cl);
  }
  return 0;
}

Assistant:

int TutorialBenchmark::main(int argc, char** argv, std::string name)
{
  commandLineParser.parseCommandLine(argc, argv);
  updateCommandLine(argc, argv);

  CommandLine commandLine(argc, argv);

#if USE_GOOGLE_BENCHMARK
  if (!params.legacy && params.minTimeOrIterations > 0)
    commandLine.add({"--benchmark_min_time=" + std::to_string(params.minTimeOrIterations)});
  if (!params.legacy && params.repetitions > 0)
    commandLine.add({"--benchmark_repetitions=" + std::to_string(params.repetitions)});
#endif

  argc = commandLine.argc();
  argv = commandLine.argv();

#ifdef USE_GOOGLE_BENCHMARK
  if (!params.legacy)
    ::benchmark::Initialize(&argc, argv);
#endif

  commandLine = CommandLine(argc, argv);

  postParseCommandLine();

  std::string benchmark_name = name;
  if (endsWith(inputFile, ".xml")) {
    benchmark_name = getFileName(inputFile);
  }
  else if (endsWith(inputFile, ".ecs")) {
    benchmark_name = getFileName(inputFile);
  }

  if (params.name != "")
    benchmark_name = params.name;

  registerBenchmark(benchmark_name, commandLine.argc(), commandLine.argv());

#ifdef USE_GOOGLE_BENCHMARK
  if (!params.legacy)
    ::benchmark::RunSpecifiedBenchmarks();
#endif

  return 0;
}